

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O2

int IDAQuadSensEwtSet(IDAMem IDA_mem,N_Vector *yQScur,N_Vector *weightQS)

{
  N_Vector p_Var1;
  int iVar2;
  long lVar3;
  double dVar4;
  
  iVar2 = IDA_mem->ida_itolQS;
  if (iVar2 == 1) {
    p_Var1 = IDA_mem->ida_ypQ;
    for (lVar3 = 0; lVar3 < IDA_mem->ida_Ns; lVar3 = lVar3 + 1) {
      N_VAbs(yQScur[lVar3],p_Var1);
      N_VScale(IDA_mem->ida_rtolQS,p_Var1,p_Var1);
      N_VAddConst(IDA_mem->ida_SatolQS[lVar3],p_Var1,p_Var1);
      if ((IDA_mem->ida_atolQSmin0[lVar3] != 0) && (dVar4 = (double)N_VMin(p_Var1), dVar4 <= 0.0)) {
        return -1;
      }
      N_VInv(p_Var1,weightQS[lVar3]);
    }
  }
  else if (iVar2 == 2) {
    p_Var1 = IDA_mem->ida_ypQ;
    for (lVar3 = 0; lVar3 < IDA_mem->ida_Ns; lVar3 = lVar3 + 1) {
      N_VAbs(yQScur[lVar3],p_Var1);
      N_VLinearSum(IDA_mem->ida_rtolQS,p_Var1,IDA_mem->ida_VatolQS[lVar3],p_Var1);
      if ((IDA_mem->ida_atolQSmin0[lVar3] != 0) && (dVar4 = (double)N_VMin(p_Var1), dVar4 <= 0.0)) {
        return -1;
      }
      N_VInv(p_Var1,weightQS[lVar3]);
    }
  }
  else if (iVar2 == 4) {
    p_Var1 = *IDA_mem->ida_tempvQS;
    for (lVar3 = 0; lVar3 < IDA_mem->ida_Ns; lVar3 = lVar3 + 1) {
      N_VScale(IDA_mem->ida_pbar[lVar3],yQScur[lVar3],p_Var1);
      iVar2 = IDAQuadEwtSet(IDA_mem,p_Var1,weightQS[lVar3]);
      if (iVar2 != 0) {
        return -1;
      }
      N_VScale(IDA_mem->ida_pbar[lVar3],weightQS[lVar3],weightQS[lVar3]);
    }
  }
  return 0;
}

Assistant:

int IDAQuadSensEwtSet(IDAMem IDA_mem, N_Vector* yQScur, N_Vector* weightQS)
{
  int flag = 0;

  switch (IDA_mem->ida_itolQS)
  {
  case IDA_EE: flag = IDAQuadSensEwtSetEE(IDA_mem, yQScur, weightQS); break;
  case IDA_SS: flag = IDAQuadSensEwtSetSS(IDA_mem, yQScur, weightQS); break;
  case IDA_SV: flag = IDAQuadSensEwtSetSV(IDA_mem, yQScur, weightQS); break;
  }

  return (flag);
}